

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBase.hpp
# Opt level: O2

ShaderCreateInfoWrapper * __thiscall
Diligent::ShaderCreateInfoWrapper::operator=
          (ShaderCreateInfoWrapper *this,ShaderCreateInfoWrapper *rhs)

{
  uint3 uStack_2b;
  
  memcpy(this,rhs,0x98);
  RefCntAutoPtr<Diligent::IShaderSourceInputStreamFactory>::operator=
            (&this->m_SourceFactory,&rhs->m_SourceFactory);
  std::__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::operator=
            ((__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
             &this->m_pRawMemory,
             (__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
             &rhs->m_pRawMemory);
  (rhs->m_CreateInfo).Source = (Char *)0x0;
  (rhs->m_CreateInfo).ByteCode = (void *)0x0;
  (rhs->m_CreateInfo).FilePath = (Char *)0x0;
  (rhs->m_CreateInfo).pShaderSourceStreamFactory = (IShaderSourceInputStreamFactory *)0x0;
  (rhs->m_CreateInfo).field_4.SourceLength = 0;
  (rhs->m_CreateInfo).EntryPoint = "main";
  (rhs->m_CreateInfo).Macros.Elements = (ShaderMacro *)0x0;
  (rhs->m_CreateInfo).Macros.Count = 0;
  (rhs->m_CreateInfo).Desc.super_DeviceObjectAttribs.Name = (Char *)0x0;
  (rhs->m_CreateInfo).Desc.ShaderType = SHADER_TYPE_UNKNOWN;
  (rhs->m_CreateInfo).Desc.UseCombinedTextureSamplers = false;
  (rhs->m_CreateInfo).Desc.CombinedSamplerSuffix = "_sampler";
  (rhs->m_CreateInfo).SourceLanguage = SHADER_SOURCE_LANGUAGE_DEFAULT;
  (rhs->m_CreateInfo).ShaderCompiler = SHADER_COMPILER_DEFAULT;
  (rhs->m_CreateInfo).HLSLVersion.Major = 0;
  (rhs->m_CreateInfo).HLSLVersion.Minor = 0;
  (rhs->m_CreateInfo).GLSLVersion.Major = 0;
  (rhs->m_CreateInfo).GLSLVersion.Minor = 0;
  (rhs->m_CreateInfo).GLESSLVersion.Major = 0;
  (rhs->m_CreateInfo).GLESSLVersion.Minor = 0;
  *(undefined8 *)((long)&(rhs->m_CreateInfo).GLESSLVersion.Minor + 1) = 0;
  *(undefined8 *)((long)&(rhs->m_CreateInfo).MSLVersion.Minor + 1) = 0;
  *(ulong *)&(rhs->m_CreateInfo).field_0x85 = (ulong)uStack_2b;
  *(undefined8 *)((long)&(rhs->m_CreateInfo).GLSLExtensions + 5) = 0;
  *(undefined4 *)((long)&(rhs->m_CreateInfo).WebGPUEmulatedArrayIndexSuffix + 4) = 0;
  return this;
}

Assistant:

ShaderCreateInfoWrapper& operator=(ShaderCreateInfoWrapper&& rhs) noexcept
    {
        m_CreateInfo    = rhs.m_CreateInfo;
        m_SourceFactory = std::move(rhs.m_SourceFactory);
        m_pRawMemory    = std::move(rhs.m_pRawMemory);

        rhs.m_CreateInfo = {};

        return *this;
    }